

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void client_map(natwm_state *state,client *client,monitor *monitor)

{
  xcb_rectangle_t rect;
  uint16_t uVar1;
  xcb_rectangle_t new_rect;
  uint32_t border_width;
  theme *theme;
  monitor *monitor_local;
  client *client_local;
  natwm_state *state_local;
  
  if (client != (client *)0x0) {
    uVar1 = client_get_active_border_width(state->workspace_list->theme,client);
    if ((client->is_fullscreen & 1U) == 0) {
      rect.y = (client->rect).y + (monitor->rect).y;
      rect.x = (client->rect).x + (monitor->rect).x;
      rect.width = (client->rect).width;
      rect.height = (client->rect).height;
      client_configure_window_rect(state->xcb,client->window,rect,(uint)uVar1);
    }
    else {
      client_configure_window_rect(state->xcb,client->window,monitor->rect,(uint)uVar1);
    }
    if ((client->state & CLIENT_HIDDEN) != 0) {
      client->state = client->state & 0xfb;
    }
    xcb_map_window(state->xcb,client->window);
  }
  return;
}

Assistant:

void client_map(const struct natwm_state *state, struct client *client,
                const struct monitor *monitor)
{
        if (client == NULL) {
                // Skip this client
                return;
        }

        struct theme *theme = state->workspace_list->theme;
        uint32_t border_width = client_get_active_border_width(theme, client);

        if (client->is_fullscreen) {
                client_configure_window_rect(
                        state->xcb, client->window, monitor->rect, border_width);
        } else {
                xcb_rectangle_t new_rect = {
                        (int16_t)(client->rect.x + monitor->rect.x),
                        (int16_t)(client->rect.y + monitor->rect.y),
                        client->rect.width,
                        client->rect.height,
                };

                client_configure_window_rect(state->xcb, client->window, new_rect, border_width);
        }

        if (client->state & CLIENT_HIDDEN) {
                client->state &= (uint8_t)~CLIENT_HIDDEN;
        }

        xcb_map_window(state->xcb, client->window);
}